

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O0

vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> * __thiscall
QPDF::getAllPages(QPDF *this)

{
  bool bVar1;
  int iVar2;
  pointer pMVar3;
  QPDFExc *this_00;
  element_type *peVar4;
  undefined4 extraout_var;
  bool local_23a;
  QPDFObjectHandle local_228;
  undefined1 local_212;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  QPDFObjectHandle local_178;
  allocator<char> local_161;
  string local_160 [32];
  QPDFObjectHandle local_140;
  allocator<char> local_129;
  string local_128;
  QPDFObjectHandle local_108;
  QPDFObjGen local_f4;
  byte local_eb;
  byte local_ea;
  allocator<char> local_e9;
  string local_e8;
  byte local_c3;
  byte local_c2;
  allocator<char> local_c1;
  string local_c0 [5];
  bool changed_pages;
  bool warned;
  undefined1 local_90 [24];
  QPDFObjectHandle pages;
  set seen;
  set visited;
  QPDF *this_local;
  
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  bVar1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::empty
                    (&pMVar3->all_pages);
  if ((bVar1) &&
     (pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m), (pMVar3->invalid_page_found & 1U) == 0)) {
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    pMVar3->ever_called_get_all_pages = true;
    QPDFObjGen::set::set
              ((set *)&seen.
                       super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
                       _M_t._M_impl.super__Rb_tree_header._M_node_count);
    QPDFObjGen::set::set
              ((set *)&pages.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    getRoot((QPDF *)local_90);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c0,"/Pages",&local_c1);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_90 + 0x10),(string *)local_90);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator(&local_c1);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_90);
    local_c2 = 0;
    local_c3 = 0;
    while( true ) {
      local_ea = 0;
      local_eb = 0;
      bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_90 + 0x10));
      local_23a = false;
      if (bVar1) {
        std::allocator<char>::allocator();
        local_ea = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"/Parent",&local_e9);
        local_eb = 1;
        local_23a = QPDFObjectHandle::hasKey((QPDFObjectHandle *)(local_90 + 0x10),&local_e8);
      }
      if ((local_eb & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_e8);
      }
      if ((local_ea & 1) != 0) {
        std::allocator<char>::~allocator(&local_e9);
      }
      if (local_23a == false) break;
      local_f4 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)(local_90 + 0x10));
      bVar1 = QPDFObjGen::set::add
                        ((set *)&pages.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount,local_f4);
      if (!bVar1) break;
      if ((local_c2 & 1) == 0) {
        getRoot((QPDF *)&local_108);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,
                   "document page tree root (root -> /Pages) doesn\'t point to the root of the page tree; attempting to correct"
                   ,&local_129);
        QPDFObjectHandle::warnIfPossible(&local_108,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator(&local_129);
        QPDFObjectHandle::~QPDFObjectHandle(&local_108);
        local_c2 = 1;
      }
      local_c3 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_160,"/Parent",&local_161);
      QPDFObjectHandle::getKey(&local_140,(string *)(local_90 + 0x10));
      QPDFObjectHandle::operator=((QPDFObjectHandle *)(local_90 + 0x10),&local_140);
      QPDFObjectHandle::~QPDFObjectHandle(&local_140);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator(&local_161);
    }
    if ((local_c3 & 1) != 0) {
      getRoot((QPDF *)&local_178);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"/Pages",&local_199);
      QPDFObjectHandle::replaceKey(&local_178,&local_198,(QPDFObjectHandle *)(local_90 + 0x10));
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator(&local_199);
      QPDFObjectHandle::~QPDFObjectHandle(&local_178);
    }
    std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::clear
              ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
               &pages.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"/Kids",&local_1c1);
    bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)(local_90 + 0x10),&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_212 = 1;
      this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar3->file);
      iVar2 = (*peVar4->_vptr_InputSource[3])();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"",&local_1e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"root of pages tree has no /Kids array",&local_211);
      QPDFExc::QPDFExc(this_00,qpdf_e_pages,(string *)CONCAT44(extraout_var,iVar2),&local_1e8,0,
                       &local_210);
      local_212 = 0;
      __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    QPDFObjectHandle::QPDFObjectHandle(&local_228,(QPDFObjectHandle *)(local_90 + 0x10));
    getAllPagesInternal(this,&local_228,
                        (set *)&seen.
                                super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                                ._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (set *)&pages.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,false);
    QPDFObjectHandle::~QPDFObjectHandle(&local_228);
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    if ((pMVar3->invalid_page_found & 1U) != 0) {
      flattenPagesTree(this);
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      pMVar3->invalid_page_found = false;
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_90 + 0x10));
    QPDFObjGen::set::~set
              ((set *)&pages.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjGen::set::~set
              ((set *)&seen.
                       super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
                       _M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  return &pMVar3->all_pages;
}

Assistant:

std::vector<QPDFObjectHandle> const&
QPDF::getAllPages()
{
    // Note that pushInheritedAttributesToPage may also be used to initialize m->all_pages.
    if (m->all_pages.empty() && !m->invalid_page_found) {
        m->ever_called_get_all_pages = true;
        QPDFObjGen::set visited;
        QPDFObjGen::set seen;
        QPDFObjectHandle pages = getRoot().getKey("/Pages");
        bool warned = false;
        bool changed_pages = false;
        while (pages.isDictionary() && pages.hasKey("/Parent")) {
            if (!seen.add(pages)) {
                // loop -- will be detected again and reported later
                break;
            }
            // Files have been found in the wild where /Pages in the catalog points to the first
            // page. Try to work around this and similar cases with this heuristic.
            if (!warned) {
                getRoot().warnIfPossible(
                    "document page tree root (root -> /Pages) doesn't point"
                    " to the root of the page tree; attempting to correct");
                warned = true;
            }
            changed_pages = true;
            pages = pages.getKey("/Parent");
        }
        if (changed_pages) {
            getRoot().replaceKey("/Pages", pages);
        }
        seen.clear();
        if (!pages.hasKey("/Kids")) {
            // Ensure we actually found a /Pages object.
            throw QPDFExc(
                qpdf_e_pages, m->file->getName(), "", 0, "root of pages tree has no /Kids array");
        }
        try {
            getAllPagesInternal(pages, visited, seen, false);
        } catch (...) {
            m->all_pages.clear();
            m->invalid_page_found = false;
            throw;
        }
        if (m->invalid_page_found) {
            flattenPagesTree();
            m->invalid_page_found = false;
        }
    }
    return m->all_pages;
}